

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,aiNode *nd)

{
  size_type __n;
  undefined1 local_9c [8];
  aiMatrix4x4 trafo;
  allocator<bool> local_4a;
  bool local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> hadit;
  aiNode *nd_local;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  *joints_local;
  MS3DImporter *this_local;
  
  hadit.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)nd;
  __n = std::
        vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
        size(joints);
  local_49 = false;
  std::allocator<bool>::allocator(&local_4a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_48,__n,&local_49,&local_4a);
  std::allocator<bool>::~allocator(&local_4a);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_9c);
  CollectChildJoints(this,joints,(vector<bool,_std::allocator<bool>_> *)local_48,
                     (aiNode *)
                     hadit.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,(aiMatrix4x4t<float> *)local_9c);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_48)
  ;
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints, aiNode* nd)
{
     std::vector<bool> hadit(joints.size(),false);
     aiMatrix4x4 trafo;

     CollectChildJoints(joints,hadit,nd,trafo);
}